

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

int __thiscall helics::BrokerBase::parseArgs(BrokerBase *this,int argc,char **argv)

{
  undefined8 this_00;
  ParseOutput PVar1;
  shared_ptr<helics::helicsCLI11App> sVar2;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  int local_54;
  __shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [16];
  char **local_30;
  __shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_54 = argc;
  local_30 = argv;
  sVar2 = generateBaseCLI((BrokerBase *)local_40);
  (*this->_vptr_BrokerBase[8])
            (&local_50,this,
             sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  this_00 = local_40._0_8_;
  std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<helics::helicsCLI11App,void>
            (local_28,&local_50);
  CLI::App::add_subcommand((App *)this_00,(App_p *)local_28);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    ((helicsCLI11App *)local_40._0_8_,&local_54,&local_30);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  return PVar1;
}

Assistant:

int BrokerBase::parseArgs(int argc, char* argv[])
{
    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(argc, argv);
    return static_cast<int>(res);
}